

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  undefined8 *puVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  size_t sVar7;
  undefined8 *puVar8;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var9;
  undefined8 extraout_RAX;
  long *plVar10;
  ulong *puVar11;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var12;
  size_type *psVar13;
  ulong uVar14;
  undefined8 uVar15;
  uint uVar16;
  char flag;
  Message error;
  char buffer [256];
  byte local_221;
  string local_220;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  string local_1c0;
  int local_19c;
  Message local_198;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_190;
  long local_188;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_180;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  long *local_158 [2];
  long local_148 [2];
  string local_138 [8];
  
LAB_0012c1cf:
  sVar3 = read(this->read_fd_,&local_221,1);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) goto code_r0x0012c1e8;
  if (iVar2 == 0) {
    this->outcome_ = DIED;
    goto LAB_0012c2d5;
  }
  if (iVar2 == 1) {
    if (local_221 < 0x52) {
      if (local_221 == 0x49) {
        iVar2 = this->read_fd_;
        Message::Message(&local_198);
        do {
          while( true ) {
            sVar3 = read(iVar2,local_138,0xff);
            uVar16 = (uint)sVar3;
            if ((int)uVar16 < 1) break;
            *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar16 & 0x7fffffff)) = 0
            ;
            sVar7 = strlen((char *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       ((long)local_198.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 0x10),(char *)local_138,sVar7);
          }
        } while ((uVar16 == 0xffffffff) && (piVar4 = __errno_location(), *piVar4 == 4));
        if (uVar16 == 0) {
          GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                             ,0x167);
          StringStreamToString
                    (&local_220,
                     (stringstream *)
                     local_198.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length);
        }
        else {
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                             ,0x16a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
          GetLastErrnoDescription_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_220._M_dataplus._M_p,
                              local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        GTestLog::~GTestLog((GTestLog *)&local_200);
        if (local_198.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)local_198.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))
                    (local_198.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
        }
      }
      else {
        if (local_221 != 0x4c) goto LAB_0012c389;
        this->outcome_ = LIVED;
      }
    }
    else if (local_221 == 0x54) {
      this->outcome_ = THREW;
    }
    else if (local_221 == 0x52) {
      this->outcome_ = RETURNED;
    }
    else {
LAB_0012c389:
      GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                         ,0x1ea);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Death test child process reported ",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unexpected status byte (",0x18);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      GTestLog::~GTestLog((GTestLog *)local_138);
    }
    goto LAB_0012c2d5;
  }
  goto LAB_0012c259;
code_r0x0012c1e8:
  piVar4 = __errno_location();
  if (*piVar4 != 4) goto LAB_0012c259;
  goto LAB_0012c1cf;
LAB_0012c259:
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     ,0x1ef);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p);
  }
  GTestLog::~GTestLog((GTestLog *)&local_220);
LAB_0012c2d5:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_158);
  local_178 = (long *)*plVar5;
  plVar10 = plVar5 + 2;
  if (local_178 == plVar10) {
    local_168 = *plVar10;
    lStack_160 = plVar5[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *plVar10;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_1e0 = (ulong *)*plVar5;
  puVar11 = (ulong *)(plVar5 + 2);
  if (local_1e0 == puVar11) {
    local_1d0 = *puVar11;
    lStack_1c8 = plVar5[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *puVar11;
  }
  local_1d8 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_19c = 0x1f2;
  StreamableToString<int>(&local_1c0,&local_19c);
  uVar14 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar14 = local_1d0;
  }
  if (uVar14 < local_1c0._M_string_length + local_1d8) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      uVar15 = local_1c0.field_2._M_allocated_capacity;
    }
    if (local_1c0._M_string_length + local_1d8 <= (ulong)uVar15) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_1e0);
      goto LAB_0012c698;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_1c0._M_dataplus._M_p);
LAB_0012c698:
  local_200 = (undefined8 *)*puVar8;
  puVar1 = puVar8 + 2;
  if (local_200 == puVar1) {
    local_1f0 = *puVar1;
    uStack_1e8 = puVar8[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *puVar1;
  }
  local_1f8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  p_Var9 = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::__cxx11::string::append((char *)&local_200);
  local_198.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       *(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&p_Var9->_M_t;
  _Var12._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(p_Var9 + 2);
  if (local_198.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl ==
      (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )_Var12._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl) {
    local_188 = *(long *)_Var12._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    _Stack_180._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          &p_Var9[3]._M_t;
    local_198.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )&local_188;
  }
  else {
    local_188 = *(long *)_Var12._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
  }
  local_190._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)&p_Var9[1]._M_t;
  p_Var9->_M_t = _Var12._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
  p_Var9[1]._M_t =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  *(undefined1 *)&p_Var9[2]._M_t = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_220._M_dataplus._M_p = (pointer)*plVar5;
  psVar13 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_220._M_dataplus._M_p == psVar13) {
    local_220.field_2._M_allocated_capacity = *psVar13;
    local_220.field_2._8_8_ = plVar5[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar13;
  }
  local_220._M_string_length = plVar5[1];
  *plVar5 = (long)psVar13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_220);
  local_138[0]._M_dataplus._M_p = (pointer)*plVar5;
  psVar13 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_138[0]._M_dataplus._M_p == psVar13) {
    local_138[0].field_2._0_8_ = *psVar13;
    local_138[0].field_2._8_8_ = plVar5[3];
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = *psVar13;
  }
  local_138[0]._M_string_length = plVar5[1];
  *plVar5 = (long)psVar13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  DeathTestAbort(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  GTestLog::~GTestLog((GTestLog *)&local_200);
  if (local_148 != (long *)0x0) {
    (**(code **)(local_148[0] + 8))(local_148);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}